

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O1

void duckdb::IntegralCompressFunction<unsigned_int,unsigned_char>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  char cVar3;
  undefined4 uVar4;
  ulong count;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  unsigned_long *puVar7;
  allocate_function_ptr_t p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar9;
  char cVar10;
  bool bVar11;
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  SelectionVector *pSVar14;
  reference pvVar15;
  VectorBuffer *pVVar16;
  idx_t iVar17;
  idx_t iVar18;
  TemplatedValidityData<unsigned_long> *pTVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  unsigned_long uVar24;
  ulong uVar25;
  idx_t idx_in_entry;
  ulong uVar26;
  optional_idx dict_size;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  Vector *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar15 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  uVar4 = *(undefined4 *)pvVar15->data;
  pvVar15 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar2 = pvVar15->vector_type;
  cVar10 = (char)uVar4;
  if (VVar2 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar5 = result->data;
    pdVar6 = pvVar15->data;
    FlatVector::VerifyFlatVector(pvVar15);
    FlatVector::VerifyFlatVector(result);
    puVar7 = (pvVar15->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar7 == (unsigned_long *)0x0) {
      if (count == 0) {
        return;
      }
      uVar26 = 0;
      do {
        pdVar5[uVar26] = (char)*(undefined4 *)(pdVar6 + uVar26 * 4) - cVar10;
        uVar26 = uVar26 + 1;
      } while (count != uVar26);
      return;
    }
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
    shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
               &(pvVar15->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
    (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
         (pvVar15->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
    if (count + 0x3f < 0x40) {
      return;
    }
    puVar7 = (pvVar15->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    uVar22 = 0;
    uVar26 = 0;
    do {
      if (puVar7 == (unsigned_long *)0x0) {
        uVar24 = 0xffffffffffffffff;
      }
      else {
        uVar24 = puVar7[uVar22];
      }
      uVar23 = uVar26 + 0x40;
      if (count <= uVar26 + 0x40) {
        uVar23 = count;
      }
      uVar21 = uVar23;
      if (uVar24 != 0) {
        uVar21 = uVar26;
        if (uVar24 == 0xffffffffffffffff) {
          if (uVar26 < uVar23) {
            do {
              pdVar5[uVar21] = (char)*(undefined4 *)(pdVar6 + uVar21 * 4) - cVar10;
              uVar21 = uVar21 + 1;
            } while (uVar23 != uVar21);
          }
        }
        else if (uVar26 < uVar23) {
          uVar20 = 0;
          do {
            if ((uVar24 >> (uVar20 & 0x3f) & 1) != 0) {
              pdVar5[uVar26] = (char)*(undefined4 *)(pdVar6 + uVar26 * 4) - cVar10;
            }
            uVar26 = uVar26 + 1;
            uVar20 = uVar20 + 1;
            uVar21 = uVar26;
          } while (uVar23 != uVar26);
        }
      }
      uVar22 = uVar22 + 1;
      uVar26 = uVar21;
    } while (uVar22 != count + 0x3f >> 6);
    return;
  }
  if (VVar2 != DICTIONARY_VECTOR) {
    if (VVar2 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar5 = result->data;
      pdVar6 = pvVar15->data;
      puVar7 = (pvVar15->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar7 != (unsigned_long *)0x0) && ((*puVar7 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *pdVar5 = (char)*(undefined4 *)pdVar6 - cVar10;
      return;
    }
    goto LAB_00906f09;
  }
  DictionaryVector::VerifyDictionary(pvVar15);
  pVVar16 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar15->buffer);
  local_78.sel = (SelectionVector *)pVVar16[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar17 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar17 * 2)) {
LAB_00906eff:
    bVar11 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(pvVar15);
    pVVar16 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar15->auxiliary);
    cVar3 = *(char *)&pVVar16[1]._vptr_VectorBuffer;
    bVar11 = false;
    if (cVar3 == '\0') {
      local_88 = (Vector *)(pVVar16 + 1);
      pdVar5 = result->data;
      pdVar6 = pVVar16[1].data.pointer;
      iVar17 = optional_idx::GetIndex((optional_idx *)&local_78);
      FlatVector::VerifyFlatVector(local_88);
      FlatVector::VerifyFlatVector(result);
      puVar7 = (unsigned_long *)pVVar16[1].data.allocated_size;
      if (puVar7 == (unsigned_long *)0x0) {
        if (iVar17 != 0) {
          iVar18 = 0;
          do {
            pdVar5[iVar18] = (char)*(undefined4 *)(pdVar6 + iVar18 * 4) - cVar10;
            iVar18 = iVar18 + 1;
          } while (iVar17 != iVar18);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(pVVar16 + 2));
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (idx_t)pVVar16[2].aux_data.
                    super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                    .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
        if (0x3f < iVar17 + 0x3f) {
          iVar18 = pVVar16[1].data.allocated_size;
          uVar22 = 0;
          uVar26 = 0;
          do {
            if (iVar18 == 0) {
              uVar23 = 0xffffffffffffffff;
            }
            else {
              uVar23 = *(ulong *)(iVar18 + uVar22 * 8);
            }
            uVar21 = uVar26 + 0x40;
            if (iVar17 <= uVar26 + 0x40) {
              uVar21 = iVar17;
            }
            uVar20 = uVar21;
            if (uVar23 != 0) {
              uVar20 = uVar26;
              if (uVar23 == 0xffffffffffffffff) {
                if (uVar26 < uVar21) {
                  do {
                    pdVar5[uVar20] = (char)*(undefined4 *)(pdVar6 + uVar20 * 4) - cVar10;
                    uVar20 = uVar20 + 1;
                  } while (uVar21 != uVar20);
                }
              }
              else if (uVar26 < uVar21) {
                uVar25 = 0;
                do {
                  if ((uVar23 >> (uVar25 & 0x3f) & 1) != 0) {
                    pdVar5[uVar26] = (char)*(undefined4 *)(pdVar6 + uVar26 * 4) - cVar10;
                  }
                  uVar26 = uVar26 + 1;
                  uVar25 = uVar25 + 1;
                  uVar20 = uVar26;
                } while (uVar21 != uVar26);
              }
            }
            uVar22 = uVar22 + 1;
            uVar26 = uVar20;
          } while (uVar22 != iVar17 + 0x3f >> 6);
        }
      }
      DictionaryVector::VerifyDictionary(pvVar15);
      pVVar16 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar15->buffer);
      iVar17 = optional_idx::GetIndex((optional_idx *)&local_78);
      Vector::Dictionary(result,result,iVar17,(SelectionVector *)(pVVar16 + 1),count);
      bVar11 = true;
    }
    if (cVar3 != '\0') goto LAB_00906eff;
  }
  if (bVar11) {
    return;
  }
LAB_00906f09:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(pvVar15,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pSVar14 = local_78.sel;
  pdVar5 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      p_Var8 = (allocate_function_ptr_t)pSVar14->sel_vector;
      uVar26 = 0;
      do {
        uVar22 = uVar26;
        if (p_Var8 != (allocate_function_ptr_t)0x0) {
          uVar22 = (ulong)*(uint *)(p_Var8 + uVar26 * 4);
        }
        pdVar5[uVar26] = (char)*(undefined4 *)(local_78.data + uVar22 * 4) - cVar10;
        uVar26 = uVar26 + 1;
      } while (count != uVar26);
    }
  }
  else if (count != 0) {
    p_Var8 = (allocate_function_ptr_t)pSVar14->sel_vector;
    uVar26 = 0;
    do {
      uVar22 = uVar26;
      if (p_Var8 != (allocate_function_ptr_t)0x0) {
        uVar22 = (ulong)*(uint *)(p_Var8 + uVar26 * 4);
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar22 >> 6]
           >> (uVar22 & 0x3f) & 1) == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_98,&local_80);
          p_Var13 = p_Stack_90;
          peVar12 = local_98;
          local_98 = (element_type *)0x0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar12;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var13;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
          }
          pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar19->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar9 = (byte)uVar26 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar26 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
      }
      else {
        pdVar5[uVar26] = (char)*(undefined4 *)(local_78.data + uVar22 * 4) - cVar10;
      }
      uVar26 = uVar26 + 1;
    } while (count != uVar26);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}